

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-stroker.c
# Opt level: O1

PVG_FT_Error PVG_FT_Stroker_ConicTo(PVG_FT_Stroker stroker,PVG_FT_Vector *control,PVG_FT_Vector *to)

{
  PVG_FT_Pos PVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  PVG_FT_Angle PVar5;
  ulong uVar6;
  PVG_FT_Angle PVar7;
  PVG_FT_Fixed PVar8;
  PVG_FT_Angle PVar9;
  PVG_FT_Fixed PVar10;
  PVG_FT_Long PVar11;
  long lVar12;
  long lVar13;
  PVG_FT_StrokeBorder border;
  long lVar14;
  long lVar15;
  ulong uVar16;
  bool bVar17;
  bool bVar18;
  PVG_FT_Vector end;
  PVG_FT_Vector ctrl;
  PVG_FT_Vector start;
  PVG_FT_Vector delta;
  PVG_FT_Vector bvec;
  PVG_FT_Vector bez_stack [34];
  PVG_FT_Pos *local_318;
  PVG_FT_Vector local_308;
  PVG_FT_Vector *local_2f8;
  PVG_FT_Angle local_2f0;
  ulong local_2e8;
  long local_2e0;
  long local_2d8;
  PVG_FT_Vector *local_2d0;
  PVG_FT_Stroker local_2c8;
  long local_2c0;
  PVG_FT_Vector local_2b8;
  PVG_FT_Vector local_2a8;
  PVG_FT_StrokeBorder local_290;
  PVG_FT_Angle local_288;
  long local_280;
  PVG_FT_Vector local_278;
  PVG_FT_Vector local_268;
  PVG_FT_Pos local_258 [4];
  PVG_FT_Pos local_238;
  PVG_FT_Pos PStack_230;
  
  local_2f8 = &stroker->center;
  if ((((((stroker->center).x - control->x) + 1U < 3) &&
       (((stroker->center).y - control->y) + 1U < 3)) && ((control->x - to->x) + 1U < 3)) &&
     ((control->y - to->y) + 1U < 3)) {
    PVar1 = to->y;
    local_2f8->x = to->x;
    (stroker->center).y = PVar1;
  }
  else {
    local_318 = local_258;
    local_258[0] = to->x;
    local_258[1] = to->y;
    local_258[2] = control->x;
    local_258[3] = control->y;
    local_238 = local_2f8->x;
    PStack_230 = (stroker->center).y;
    local_290 = stroker->borders;
    bVar3 = true;
    uVar16 = 0;
    local_2d0 = to;
    local_2c8 = stroker;
    do {
      PVar5 = stroker->angle_in;
      PVar9 = PVar5;
      local_2e8 = uVar16;
      if (uVar16 < 0x1e0) {
        local_2d8 = local_318[1];
        local_2f0 = local_318[2];
        lVar12 = local_318[4];
        local_2c0 = local_318[3];
        local_2e0 = local_318[5];
        lVar13 = *(long *)((long)local_258 + uVar16);
        lVar14 = lVar13 - local_2f0;
        lVar15 = local_2d8 - local_2c0;
        bVar17 = 2 < lVar14 + 1U;
        bVar18 = 2 < lVar15 + 1U;
        if ((local_2c0 - local_2e0) + 1U < 3 && (local_2f0 - lVar12) + 1U < 3) {
          if (bVar18 || bVar17) {
            PVar5 = PVG_FT_Atan2(lVar14,lVar15);
            PVar9 = PVar5;
          }
        }
        else {
          PVar9 = PVG_FT_Atan2(local_2f0 - lVar12,local_2c0 - local_2e0);
          PVar5 = PVar9;
          if (bVar18 || bVar17) {
            PVar5 = PVG_FT_Atan2(lVar14,lVar15);
          }
        }
        uVar6 = PVG_FT_Angle_Diff(PVar9,PVar5);
        uVar16 = -uVar6;
        if (0 < (long)uVar6) {
          uVar16 = uVar6;
        }
        stroker = local_2c8;
        if (uVar16 < 0x1e0000) goto LAB_0011d06a;
        if (local_2c8->first_point != '\0') {
          local_2c8->angle_in = PVar9;
        }
        local_318[8] = lVar12;
        lVar13 = lVar13 + local_2f0;
        local_318[6] = lVar12 + local_2f0 >> 1;
        local_318[4] = lVar13 + lVar12 + local_2f0 >> 2;
        local_318[2] = lVar13 >> 1;
        local_318[9] = local_2e0;
        local_318[7] = local_2e0 + local_2c0 >> 1;
        local_318[5] = local_2d8 + local_2c0 + local_2e0 + local_2c0 >> 2;
        local_318[3] = local_2d8 + local_2c0 >> 1;
        uVar16 = local_2e8 + 0x20;
        iVar4 = 3;
      }
      else {
LAB_0011d06a:
        if (bVar3) {
          if (stroker->first_point == '\0') {
            stroker->angle_out = PVar9;
            ft_stroker_process_corner(stroker,0);
          }
          else {
            ft_stroker_subpath_start(stroker,PVar9,0);
          }
        }
        else {
          uVar6 = PVG_FT_Angle_Diff(stroker->angle_in,PVar9);
          uVar16 = -uVar6;
          if (0 < (long)uVar6) {
            uVar16 = uVar6;
          }
          if (0x78000 < uVar16) {
            PVar1 = local_318[5];
            local_2f8->x = local_318[4];
            local_2f8->y = PVar1;
            stroker->angle_out = PVar9;
            stroker->line_join = PVG_FT_STROKER_LINEJOIN_ROUND;
            ft_stroker_process_corner(stroker,0);
            stroker->line_join = stroker->line_join_saved;
          }
        }
        PVar7 = PVG_FT_Angle_Diff(PVar9,PVar5);
        local_2d8 = PVar7 / 2;
        PVar11 = stroker->radius;
        PVar8 = PVG_FT_Cos(local_2d8);
        local_2c0 = PVG_FT_DivFix(PVar11,PVar8);
        uVar16 = local_2e8;
        local_2e0 = PVar5;
        if (stroker->handle_wide_strokes == '\0') {
          local_2f0 = 0;
        }
        else {
          local_2f0 = PVG_FT_Atan2(*(long *)((long)local_258 + local_2e8) - local_318[4],
                                   local_318[1] - local_318[5]);
        }
        local_2d8 = local_2d8 + PVar9;
        lVar12 = 0x5a0000;
        border = local_290;
        do {
          PVG_FT_Vector_From_Polar(&local_2b8,local_2c0,local_2d8 + lVar12);
          local_2b8.x = local_2b8.x + local_318[2];
          local_2b8.y = local_2b8.y + local_318[3];
          PVG_FT_Vector_From_Polar(&local_308,stroker->radius,local_2e0 + lVar12);
          lVar13 = *(long *)((long)local_258 + uVar16);
          local_308.x = local_308.x + lVar13;
          lVar14 = local_318[1];
          local_308.y = local_308.y + lVar14;
          if (stroker->handle_wide_strokes == '\0') {
LAB_0011d377:
            ft_stroke_border_conicto(border,&local_2b8,&local_308);
          }
          else {
            lVar15 = border->points[border->num_points - 1].x;
            lVar2 = border->points[border->num_points - 1].y;
            local_2a8.x = lVar15;
            local_2a8.y = lVar2;
            PVar5 = PVG_FT_Atan2(local_308.x - lVar15,local_308.y - lVar2);
            uVar6 = PVG_FT_Angle_Diff(local_2f0,PVar5);
            uVar16 = -uVar6;
            if (0 < (long)uVar6) {
              uVar16 = uVar6;
            }
            iVar4 = 0;
            if (0x5a0000 < uVar16) {
              local_280 = lVar15;
              local_288 = PVG_FT_Atan2(local_318[4] - lVar15,local_318[5] - lVar2);
              PVar9 = PVG_FT_Atan2(lVar13 - local_308.x,lVar14 - local_308.y);
              local_268.x = local_308.x - lVar15;
              local_268.y = local_308.y - lVar2;
              PVar8 = PVG_FT_Vector_Length(&local_268);
              PVar10 = PVG_FT_Sin(PVar5 - PVar9);
              PVar5 = local_288;
              lVar13 = -PVar10;
              if (0 < PVar10) {
                lVar13 = PVar10;
              }
              PVar10 = PVG_FT_Sin(local_288 - PVar9);
              lVar14 = -PVar10;
              if (0 < PVar10) {
                lVar14 = PVar10;
              }
              PVar11 = PVG_FT_MulDiv(PVar8,lVar13,lVar14);
              PVG_FT_Vector_From_Polar(&local_278,PVar11,PVar5);
              local_278.x = local_278.x + local_280;
              local_278.y = local_278.y + lVar2;
              border->movable = '\0';
              ft_stroke_border_lineto(border,&local_278,'\0');
              ft_stroke_border_lineto(border,&local_308,'\0');
              ft_stroke_border_conicto(border,&local_2b8,&local_2a8);
              ft_stroke_border_lineto(border,&local_308,'\0');
              iVar4 = 7;
            }
            stroker = local_2c8;
            uVar16 = local_2e8;
            if (iVar4 != 7) {
              if (iVar4 == 0) goto LAB_0011d377;
              goto LAB_0011d3a3;
            }
          }
          border = border + 1;
          lVar12 = lVar12 + -0xb40000;
        } while (lVar12 == -0x5a0000);
        iVar4 = 0;
LAB_0011d3a3:
        bVar3 = false;
        if (iVar4 == 0) {
          uVar16 = uVar16 - 0x20;
          stroker->angle_in = local_2e0;
          iVar4 = 0;
        }
      }
      if ((iVar4 != 3) && (iVar4 != 0)) {
        return 0;
      }
      local_318 = (PVG_FT_Pos *)((long)local_258 + uVar16);
    } while (-1 < (long)uVar16);
    PVar1 = local_2d0->y;
    local_2f8->x = local_2d0->x;
    local_2f8->y = PVar1;
    stroker->line_length = 0;
  }
  return 0;
}

Assistant:

PVG_FT_Error PVG_FT_Stroker_ConicTo(PVG_FT_Stroker stroker, PVG_FT_Vector* control,
                                  PVG_FT_Vector* to)
{
    PVG_FT_Error   error = 0;
    PVG_FT_Vector  bez_stack[34];
    PVG_FT_Vector* arc;
    PVG_FT_Vector* limit = bez_stack + 30;
    PVG_FT_Bool    first_arc = TRUE;

    /* if all control points are coincident, this is a no-op; */
    /* avoid creating a spurious corner                       */
    if (PVG_FT_IS_SMALL(stroker->center.x - control->x) &&
        PVG_FT_IS_SMALL(stroker->center.y - control->y) &&
        PVG_FT_IS_SMALL(control->x - to->x) &&
        PVG_FT_IS_SMALL(control->y - to->y)) {
        stroker->center = *to;
        goto Exit;
    }

    arc = bez_stack;
    arc[0] = *to;
    arc[1] = *control;
    arc[2] = stroker->center;

    while (arc >= bez_stack) {
        PVG_FT_Angle angle_in, angle_out;

        /* initialize with current direction */
        angle_in = angle_out = stroker->angle_in;

        if (arc < limit &&
            !ft_conic_is_small_enough(arc, &angle_in, &angle_out)) {
            if (stroker->first_point) stroker->angle_in = angle_in;

            ft_conic_split(arc);
            arc += 2;
            continue;
        }

        if (first_arc) {
            first_arc = FALSE;

            /* process corner if necessary */
            if (stroker->first_point)
                error = ft_stroker_subpath_start(stroker, angle_in, 0);
            else {
                stroker->angle_out = angle_in;
                error = ft_stroker_process_corner(stroker, 0);
            }
        } else if (ft_pos_abs(PVG_FT_Angle_Diff(stroker->angle_in, angle_in)) >
                   PVG_FT_SMALL_CONIC_THRESHOLD / 4) {
            /* if the deviation from one arc to the next is too great, */
            /* add a round corner                                      */
            stroker->center = arc[2];
            stroker->angle_out = angle_in;
            stroker->line_join = PVG_FT_STROKER_LINEJOIN_ROUND;

            error = ft_stroker_process_corner(stroker, 0);

            /* reinstate line join style */
            stroker->line_join = stroker->line_join_saved;
        }

        if (error) goto Exit;

        /* the arc's angle is small enough; we can add it directly to each */
        /* border                                                          */
        {
            PVG_FT_Vector       ctrl, end;
            PVG_FT_Angle        theta, phi, rotate, alpha0 = 0;
            PVG_FT_Fixed        length;
            PVG_FT_StrokeBorder border;
            PVG_FT_Int          side;

            theta = PVG_FT_Angle_Diff(angle_in, angle_out) / 2;
            phi = angle_in + theta;
            length = PVG_FT_DivFix(stroker->radius, PVG_FT_Cos(theta));

            /* compute direction of original arc */
            if (stroker->handle_wide_strokes)
                alpha0 = PVG_FT_Atan2(arc[0].x - arc[2].x, arc[0].y - arc[2].y);

            for (border = stroker->borders, side = 0; side <= 1;
                 side++, border++) {
                rotate = PVG_FT_SIDE_TO_ROTATE(side);

                /* compute control point */
                PVG_FT_Vector_From_Polar(&ctrl, length, phi + rotate);
                ctrl.x += arc[1].x;
                ctrl.y += arc[1].y;

                /* compute end point */
                PVG_FT_Vector_From_Polar(&end, stroker->radius,
                                        angle_out + rotate);
                end.x += arc[0].x;
                end.y += arc[0].y;

                if (stroker->handle_wide_strokes) {
                    PVG_FT_Vector start;
                    PVG_FT_Angle  alpha1;

                    /* determine whether the border radius is greater than the
                     */
                    /* radius of curvature of the original arc */
                    start = border->points[border->num_points - 1];

                    alpha1 = PVG_FT_Atan2(end.x - start.x, end.y - start.y);

                    /* is the direction of the border arc opposite to */
                    /* that of the original arc? */
                    if (ft_pos_abs(PVG_FT_Angle_Diff(alpha0, alpha1)) >
                        PVG_FT_ANGLE_PI / 2) {
                        PVG_FT_Angle  beta, gamma;
                        PVG_FT_Vector bvec, delta;
                        PVG_FT_Fixed  blen, sinA, sinB, alen;

                        /* use the sine rule to find the intersection point */
                        beta =
                            PVG_FT_Atan2(arc[2].x - start.x, arc[2].y - start.y);
                        gamma = PVG_FT_Atan2(arc[0].x - end.x, arc[0].y - end.y);

                        bvec.x = end.x - start.x;
                        bvec.y = end.y - start.y;

                        blen = PVG_FT_Vector_Length(&bvec);

                        sinA = ft_pos_abs(PVG_FT_Sin(alpha1 - gamma));
                        sinB = ft_pos_abs(PVG_FT_Sin(beta - gamma));

                        alen = PVG_FT_MulDiv(blen, sinA, sinB);

                        PVG_FT_Vector_From_Polar(&delta, alen, beta);
                        delta.x += start.x;
                        delta.y += start.y;

                        /* circumnavigate the negative sector backwards */
                        border->movable = FALSE;
                        error = ft_stroke_border_lineto(border, &delta, FALSE);
                        if (error) goto Exit;
                        error = ft_stroke_border_lineto(border, &end, FALSE);
                        if (error) goto Exit;
                        error = ft_stroke_border_conicto(border, &ctrl, &start);
                        if (error) goto Exit;
                        /* and then move to the endpoint */
                        error = ft_stroke_border_lineto(border, &end, FALSE);
                        if (error) goto Exit;

                        continue;
                    }

                    /* else fall through */
                }

                /* simply add an arc */
                error = ft_stroke_border_conicto(border, &ctrl, &end);
                if (error) goto Exit;
            }
        }

        arc -= 2;

        stroker->angle_in = angle_out;
    }

    stroker->center = *to;
    stroker->line_length = 0;

Exit:
    return error;
}